

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestResult::Clear(TestResult *this)

{
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::_M_erase_at_end
            (&this->test_part_results_,
             (this->test_part_results_).
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::_M_erase_at_end
            (&this->test_properties_,
             (this->test_properties_).
             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
             _M_impl.super__Vector_impl_data._M_start);
  this->death_test_count_ = 0;
  this->elapsed_time_ = 0;
  return;
}

Assistant:

void TestResult::Clear() {
  test_part_results_.clear();
  test_properties_.clear();
  death_test_count_ = 0;
  elapsed_time_ = 0;
}